

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,int *out,
               byte param_4,int *param_5)

{
  int iVar1;
  ulong uVar2;
  reference piVar3;
  int *piVar4;
  ulong local_b8;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_a8;
  T presum;
  int local_a0 [2];
  T sum;
  int *local_88;
  int *local_80;
  int *local_78;
  undefined1 local_70 [8];
  comm nonzero_comm;
  size_t n;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> o;
  comm *comm_local;
  bool commutative_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  comm_local._6_1_ = param_4 & 1;
  nonzero_comm._24_8_ = end._M_current;
  n = (size_t)out;
  o._M_current = param_5;
  _Stack_20._M_current = out;
  out_local._M_current = end._M_current;
  uVar2 = std::
          distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (begin,end);
  comm::split((comm *)local_70,(comm *)o._M_current,(uint)(uVar2 != 0));
  if (uVar2 != 0) {
    local_80 = out_local._M_current;
    local_88 = _Stack_20._M_current;
    local_78 = begin._M_current;
    local_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
              (begin._M_current,out_local._M_current,_Stack_20._M_current);
    _Stack_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&stack0xffffffffffffffe0,uVar2 - 1);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&stack0xffffffffffffff58);
    local_a0[0] = *piVar3;
    i._4_4_ = exscan<int,mxx::min<int>>(local_a0,local_70,comm_local._6_1_ & 1);
    iVar1 = comm::rank((comm *)local_70);
    if (iVar1 != 0) {
      for (local_b8 = 0; local_b8 < uVar2; local_b8 = local_b8 + 1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
        piVar4 = min<int>::operator()
                           ((min<int> *)((long)&comm_local + 7),(int *)((long)&i + 4),piVar3);
        iVar1 = *piVar4;
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
        *piVar3 = iVar1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      }
    }
  }
  comm::~comm((comm *)local_70);
  return;
}

Assistant:

void global_scan(InIterator begin, InIterator end, OutIterator out, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    // create subcommunicator for those processes which contain elements
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local scan
        local_scan(begin, end, out, func);
        // mxx::scan
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(out+(n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);
        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}